

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O1

void __thiscall
swrenderer::WallSampler::WallSampler
          (WallSampler *this,int y1,float swal,double yrepeat,fixed_t xoffset,FTexture *texture,
          _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  ushort uVar1;
  uint uVar2;
  BYTE *pBVar3;
  uint uVar4;
  byte bVar5;
  double __x;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = texture->Height;
  this->height = (uint)uVar1;
  if (texture->HeightBits == '\0') {
    this->uv_pos = 0;
    this->uv_step = 0;
    this->uv_max = 1;
  }
  else {
    bVar5 = -texture->HeightBits;
    dVar8 = (double)uVar1;
    this->uv_max = (uint)uVar1 << (bVar5 & 0x1f);
    __x = ((((double)y1 + 0.5) - CenterY) * (double)swal * yrepeat + dc_texturemid) / dVar8;
    dVar6 = floor(__x);
    dVar7 = (double)(1 << (bVar5 & 0x1f));
    this->uv_pos = (uint32_t)(long)(dVar8 * dVar7 * (__x - dVar6));
    uVar2 = SUB84(6755399441055744.0 / dVar7 + (double)swal * yrepeat,0);
    uVar4 = 1;
    if (1 < uVar2) {
      uVar4 = uVar2;
    }
    this->uv_step = uVar4;
  }
  pBVar3 = (*getcol)(texture,xoffset >> 0x10);
  this->source = pBVar3;
  return;
}

Assistant:

WallSampler::WallSampler(int y1, float swal, double yrepeat, fixed_t xoffset, FTexture *texture, const BYTE*(*getcol)(FTexture *texture, int x))
{
	height = texture->GetHeight();

	int uv_fracbits = 32 - texture->HeightBits;
	if (uv_fracbits != 32)
	{
		uv_max = height << uv_fracbits;

		// Find start uv in [0-base_height[ range.
		// Not using xs_ToFixed because it rounds the result and we need something that always rounds down to stay within the range.
		double uv_stepd = swal * yrepeat;
		double v = (dc_texturemid + uv_stepd * (y1 - CenterY + 0.5)) / height;
		v = v - floor(v);
		v *= height;
		v *= (1 << uv_fracbits);

		uv_pos = (uint32_t)v;
		uv_step = xs_ToFixed(uv_fracbits, uv_stepd);
		if (uv_step == 0) // To prevent divide by zero elsewhere
			uv_step = 1;
	}
	else
	{ // Hack for one pixel tall textures
		uv_pos = 0;
		uv_step = 0;
		uv_max = 1;
	}

	source = getcol(texture, xoffset >> FRACBITS);
}